

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetLocationWorldCoordinates
          (LE_Detonation_PDU *this,RelativeWorldCoordinates *L)

{
  KUINT16 *pKVar1;
  
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 0x40) != 0) {
    (this->m_DetonationFlag1Union).m_ui8Flag = (this->m_DetonationFlag1Union).m_ui8Flag & 0xbf;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 2;
  }
  DATA_TYPE::RelativeWorldCoordinates::operator=(&this->m_LocWrldCoord,L);
  return;
}

Assistant:

void LE_Detonation_PDU::SetLocationInEntityCoordinatesFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_DetonationFlag1Union.m_ui8LocationTyp )return;

    m_DetonationFlag1Union.m_ui8LocationTyp = F;

    if( F )
    {
        m_ui16PDULength -= RelativeWorldCoordinates::RELATVE_WORLD_COORDINATES_SIZE;
        m_ui16PDULength += LE_Vector16_3::LE_VECTOR_SIZE;
    }
    else
    {
        m_ui16PDULength += RelativeWorldCoordinates::RELATVE_WORLD_COORDINATES_SIZE;
        m_ui16PDULength -= LE_Vector16_3::LE_VECTOR_SIZE;
    }
}